

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.cc
# Opt level: O0

t_object * __thiscall t_queue::f_string(t_queue *this)

{
  t_object *ptVar1;
  t_queue *this_local;
  
  ptVar1 = xemmai::t_sharable::
           f_owned_or_shared<xemmai::t_shared_lock_with_safe_region,t_queue::f_string()::__0>
                     (&this->super_t_sharable,(anon_class_8_1_8991fb9c)this);
  return ptVar1;
}

Assistant:

t_object* t_queue::f_string()
{
	return f_owned_or_shared<t_shared_lock_with_safe_region>([&]
	{
		std::vector<wchar_t> cs;
		if (v_head) {
			t_object* pair = v_head->f_as<t_pair>().v_next;
			while (true) {
				if (auto p = f_string_or_null(pair->f_as<t_pair>().v_value)) {
					auto& s = p->f_as<t_string>();
					cs.insert(cs.end(), static_cast<const wchar_t*>(s), s + s.f_size());
				} else {
					auto s = L"<unprintable>"sv;
					cs.insert(cs.end(), s.begin(), s.end());
				}
				cs.push_back(L'\n');
				if (pair == v_head) break;
				pair = pair->f_as<t_pair>().v_next;
			}
		}
		return t_string::f_instantiate(cs.data(), cs.size());
	});
}